

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvar.c
# Opt level: O2

LispPTR N_OP_fvarn(int n)

{
  DLword *achain;
  ushort uVar1;
  LispPTR *pLVar2;
  
  achain = MachineState.pvar + n;
  uVar1 = *(ushort *)((ulong)achain ^ 2);
  if ((uVar1 & 1) != 0) {
    nfvlookup((frameex1 *)(MachineState.pvar + -10),achain,MachineState.currentfunc);
    uVar1 = *(ushort *)((ulong)achain ^ 2);
  }
  pLVar2 = NativeAligned4FromLAddr
                     ((*(ushort *)((ulong)(achain + 1) ^ 2) & 0xfff) << 0x10 | (uint)uVar1);
  return *pLVar2;
}

Assistant:

LispPTR N_OP_fvarn(int n)
/* n is word offset */

{
  DLword *chain; /* keep FVAR slot2 in CurrentFrameExtension */

  chain = PVar + n;

  if (WBITSPTR(chain)->LSB) {
    /* check 15bit of FVAR slot1 in CurrentFrameExtension.
       0: bound
       1: unbound */
    nfvlookup(CURRENTFX, chain, FuncObj);
  }

  return (GetLongWord(
      NativeAligned4FromLAddr(POINTERMASK & (((GETBASEWORD(chain, 1)) << 16) | GETBASEWORD(chain, 0)))));
}